

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::ThreadData::ThreadData
          (ThreadData *this,
          QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
          *i_parent_tester,FeedBack *i_feedback,
          conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *i_queue,EasyRandom *i_main_random,QueueTesterFlags i_flags)

{
  size_type i_put_type_count;
  IncrementalStats *this_00;
  unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
  local_50 [3];
  QueueTesterFlags local_34;
  EasyRandom *pEStack_30;
  QueueTesterFlags i_flags_local;
  EasyRandom *i_main_random_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *i_queue_local;
  FeedBack *i_feedback_local;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *i_parent_tester_local;
  ThreadData *this_local;
  
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)this = i_queue;
  *(QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
    **)(this + 8) = i_parent_tester;
  *(QueueTesterFlags *)(this + 0x10) = i_flags;
  local_34 = i_flags;
  pEStack_30 = i_main_random;
  i_main_random_local = (EasyRandom *)i_queue;
  i_queue_local =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)i_feedback;
  i_feedback_local = (FeedBack *)i_parent_tester;
  i_parent_tester_local =
       (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
        *)this;
  std::thread::thread((thread *)(this + 0x18));
  i_put_type_count =
       std::
       vector<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
       ::size((vector<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
               *)(i_feedback_local + 0x40));
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
  ::FinalStats::FinalStats((FinalStats *)(this + 0x20),i_put_type_count);
  std::
  unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats,std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats>>
  ::
  unique_ptr<std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats>,void>
            ((unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats,std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats>>
              *)(this + 0x48));
  EasyRandom::fork((EasyRandom *)(this + 0x50));
  *(undefined8 *)(this + 0x13e0) = 0;
  *(undefined8 *)(this + 0x13e8) = 0;
  std::
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantPut>_>
  ::vector((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantPut>_>
            *)(this + 0x13f0));
  std::
  vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantConsume>_>
  ::vector((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::ThreadData::ReentrantConsume>_>
            *)(this + 0x1408));
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)(this + 0x1420) = i_queue_local;
  this_00 = (IncrementalStats *)operator_new(0x18);
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
  ::IncrementalStats::IncrementalStats(this_00);
  std::
  unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats,std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats>>
  ::
  unique_ptr<std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats>,void>
            ((unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats,std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::IncrementalStats>>
              *)local_50,this_00);
  std::
  unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats>_>
  ::operator=((unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats>_>
               *)(this + 0x48),local_50);
  std::
  unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats>_>
  ::~unique_ptr((unique_ptr<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::IncrementalStats>_>
                 *)local_50);
  return;
}

Assistant:

ThreadData(
              const QueueGenericTester & i_parent_tester,
              const FeedBack *           i_feedback,
              QUEUE &                    i_queue,
              EasyRandom &               i_main_random,
              QueueTesterFlags           i_flags)
                : m_queue(i_queue), m_parent_tester(i_parent_tester), m_flags(i_flags),
                  m_final_stats(i_parent_tester.m_put_cases.size()), m_random(i_main_random.fork()),
                  m_feedback(i_feedback)
            {
                m_incremental_stats = std::unique_ptr<IncrementalStats>(new IncrementalStats);
            }